

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O2

int Rml::Math::Log2(int value)

{
  int result;
  
  result = 0;
  for (; 1 < value; value = (uint)value >> 1) {
    result = result + 1;
  }
  return result;
}

Assistant:

RMLUICORE_API int Log2(int value)
	{
		int result = 0;
		while (value > 1)
		{
			value >>= 1;
			result++;
		}
		return result;
	}